

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O2

void __thiscall
Lib::
Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::FastInstancesIterator,Lib::DefaultReset,Lib::DefaultKeepRecycled>
::
Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node*,Kernel::Literal*,bool,bool>
          (Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::FastInstancesIterator,Lib::DefaultReset,Lib::DefaultKeepRecycled>
           *this,SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *a,Node *as,
          Literal *as_1,bool as_2,bool as_3)

{
  undefined1 local_42;
  undefined1 local_41;
  Literal *local_40;
  Node *local_38;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *local_30;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> **local_28;
  Node **local_20;
  Literal **local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_28 = &local_30;
  local_20 = &local_38;
  local_18 = &local_40;
  local_10 = &local_41;
  local_8 = &local_42;
  local_42 = as_3;
  local_41 = as_2;
  local_40 = as_1;
  local_38 = as;
  local_30 = a;
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::FastInstancesIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>_*,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*,_Kernel::Literal_*,_bool,_bool>
  ::anon_class_40_5_898dd9c1::operator()((anon_class_40_5_898dd9c1 *)this);
  return;
}

Assistant:

Recycled(A a, As... as) 
    : _self([&](){ 
        if (mem().isNonEmpty()) {
          auto elem = mem().pop();
          elem->init(std::move(a), std::move(as)...);
          return elem;
        } else {
          return IF_USE_PTRS(std::make_unique<T>, T)(std::move(a), std::move(as)...);
        }
    }())
  { }